

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_maze.cpp
# Opt level: O1

int random_maze(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *maze,int N)

{
  int iVar1;
  ulong uVar2;
  int j;
  ulong uVar3;
  int max1;
  uint uVar4;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      uVar3 = 0;
      uVar4 = 0;
      do {
        iVar1 = 0;
        if (uVar4 <= (uint)N >> 1) {
          iVar1 = rand();
          iVar1 = iVar1 % 2;
        }
        *(int *)(*(long *)&(maze->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar2].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + uVar3 * 4) = iVar1;
        uVar4 = uVar4 + (iVar1 == 1);
        uVar3 = uVar3 + 1;
      } while ((uint)N != uVar3);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)N);
  }
  return 1;
}

Assistant:

int random_maze(vector<vector<int>> &maze, int N)
{
	try
	{

		for (int i = 0; i < N; i++)
		{
			int max1 = 0;
			for (int j = 0; j < N; j++)
			{
				if (max1 <= N / 2)
					maze[i][j] = rand() % 2;
				else
					maze[i][j] = 0;

				if (maze[i][j] == 1)
					max1++;
			}
		}
		return 1;
	}
	catch (const std::exception &)
	{
		cerr << "maze init error";
		return -1;
	}
}